

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

Bool CopyAttrs(TidyDocImpl *doc,Node *node,Node *child)

{
  Attribute *pAVar1;
  AttVal *pAVar2;
  AttVal *pAVar3;
  TidyAttrId id;
  
  pAVar2 = prvTidyAttrGetById(child,TidyAttr_ID);
  if ((pAVar2 != (AttVal *)0x0) &&
     (pAVar2 = prvTidyAttrGetById(node,TidyAttr_ID), pAVar2 != (AttVal *)0x0)) {
    return no;
  }
  pAVar2 = child->attributes;
  do {
    while( true ) {
      if (pAVar2 == (AttVal *)0x0) {
        return yes;
      }
      pAVar1 = pAVar2->dict;
      id = TidyAttr_UNKNOWN;
      if (pAVar1 != (Attribute *)0x0) break;
LAB_0014e78c:
      if ((id != TidyAttr_UNKNOWN) &&
         (pAVar3 = prvTidyAttrGetById(node,id), pAVar3 != (AttVal *)0x0)) {
        prvTidyRemoveAttribute(doc,node,pAVar3);
      }
      prvTidyDetachAttribute(child,pAVar2);
      pAVar3 = pAVar2->next;
      pAVar2->next = (AttVal *)0x0;
      prvTidyInsertAttributeAtEnd(node,pAVar2);
      pAVar2 = pAVar3;
    }
    if (pAVar1->id != TidyAttr_STYLE) {
      if (pAVar1 != (Attribute *)0x0) {
        if (pAVar1->id == TidyAttr_CLASS) goto LAB_0014e77f;
        if (pAVar1 != (Attribute *)0x0) {
          id = pAVar1->id;
        }
      }
      goto LAB_0014e78c;
    }
LAB_0014e77f:
    pAVar2 = pAVar2->next;
  } while( true );
}

Assistant:

static Bool CopyAttrs( TidyDocImpl* doc, Node *node, Node *child)
{
    AttVal *av1, *av2;
    TidyAttrId id;

    /* Detect attributes that cannot be merged or overwritten. */
    if (TY_(AttrGetById)(child, TidyAttr_ID) != NULL
        && TY_(AttrGetById)(node, TidyAttr_ID) != NULL)
        return no;

    /* Move child attributes to node. Attributes in node
     can be overwritten or merged. */
    for (av2 = child->attributes; av2; )
    {
        /* Dealt by MergeStyles. */
        if (attrIsSTYLE(av2) || attrIsCLASS(av2))
        {
            av2 = av2->next;
            continue;
        }
        /* Avoid duplicates in node */
        if ((id=AttrId(av2)) != TidyAttr_UNKNOWN
            && (av1=TY_(AttrGetById)(node, id))!= NULL)
            TY_(RemoveAttribute)( doc, node, av1 );

        /* Move attribute from child to node */
        TY_(DetachAttribute)( child, av2 );
        av1 = av2;
        av2 = av2->next;
        av1->next = NULL;
        TY_(InsertAttributeAtEnd)( node, av1 );
    }

    return yes;
}